

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImageImplementation.hpp
# Opt level: O3

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::~DiskImageHolder
          (DiskImageHolder<Storage::Disk::WOZ> *this)

{
  AsyncTaskQueue<true,_true,_void> *this_00;
  pointer puVar1;
  
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_0058fb50;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_0058fbb0;
  this_00 = (this->super_DiskImageHolderBase).update_queue_._M_t.
            super___uniq_ptr_impl<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
            .super__Head_base<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_false>.
            _M_head_impl;
  if (this_00 != (AsyncTaskQueue<true,_true,_void> *)0x0) {
    Concurrency::AsyncTaskQueue<true,_true,_void>::flush(this_00);
  }
  (this->disk_image_).super_DiskImage._vptr_DiskImage = (_func_int **)&PTR__WOZ_005a2a70;
  puVar1 = (this->disk_image_).post_crc_contents_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->disk_image_).post_crc_contents_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  FileHolder::~FileHolder(&(this->disk_image_).file_);
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolderBase_0058e350;
  std::
  unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
  ::~unique_ptr(&(this->super_DiskImageHolderBase).update_queue_);
  std::
  _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  ::~_Rb_tree(&(this->super_DiskImageHolderBase).cached_tracks_._M_t);
  std::
  _Rb_tree<Storage::Disk::Track::Address,_Storage::Disk::Track::Address,_std::_Identity<Storage::Disk::Track::Address>,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
  ::~_Rb_tree(&(this->super_DiskImageHolderBase).unwritten_tracks_._M_t);
  return;
}

Assistant:

DiskImageHolder<T>::~DiskImageHolder() {
	if(update_queue_) update_queue_->flush();
}